

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void clunk::InitRookMoves(int from)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  uint64_t map;
  uint uVar5;
  uint uVar6;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x21b,"void clunk::InitRookMoves(const int)");
  }
  lVar3 = 0;
  map = 0;
  iVar4 = 0;
  do {
    iVar1 = (&DAT_001490d0)[lVar3];
    if ((iVar1 + from & 0xffffff88U) == 0) {
      uVar5 = from;
      do {
        uVar6 = iVar1 * 2 + uVar5;
        uVar5 = uVar5 + iVar1;
      } while ((uVar6 & 0xffffff88) == 0);
      if ((uVar5 & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(end)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x226,"void clunk::InitRookMoves(const int)");
      }
      if ((from & 0xffffff88U) != 0) {
        __assert_fail("IS_SQUARE(from)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x106,"int clunk::Direction(const int, const int)");
      }
      if (iVar1 != (char)(&_dir)[(ulong)uVar5 + (ulong)(uint)from * 0x80]) {
        __assert_fail("Direction(from, end) == dir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x227,"void clunk::InitRookMoves(const int)");
      }
      if (0x18 < iVar4) {
        __assert_fail("shift <= 24",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x228,"void clunk::InitRookMoves(const int)");
      }
      map = map | (ulong)(uVar5 + 1) << ((byte)iVar4 & 0x3f);
      iVar4 = iVar4 + 8;
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      bVar2 = VerifyMoveMap(from,map);
      if (bVar2) {
        (&DAT_0016a880)[(uint)from] = map;
        return;
      }
      __assert_fail("VerifyMoveMap(from, mvs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x22d,"void clunk::InitRookMoves(const int)");
    }
  } while( true );
}

Assistant:

void InitRookMoves(const int from) {
  assert(IS_SQUARE(from));
  const int DIRECTION[4] = {
    South, West, East, North
  };
  uint64_t mvs = 0ULL;
  int shift = 0;
  for (int i = 0; i < 4; ++i) {
    const int dir = DIRECTION[i];
    int end = (from + dir);
    if (IS_SQUARE(end)) {
      while (IS_SQUARE(end + dir)) end += dir;
      assert(IS_SQUARE(end));
      assert(Direction(from, end) == dir);
      assert(shift <= 24);
      mvs |= (uint64_t(end + 1) << shift);
      shift += 8;
    }
  }
  assert(VerifyMoveMap(from, mvs));
  _bishopRook[from + 8] = mvs;
}